

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ostream * doctest::detail::getTlsOss(void)

{
  long *plVar1;
  string *psVar2;
  ostream *poVar3;
  allocator local_29;
  string local_28 [32];
  
  plVar1 = (long *)g_oss_abi_cxx11_();
  std::ios::clear((int)plVar1 + (int)*(undefined8 *)(*plVar1 + -0x18));
  psVar2 = (string *)g_oss_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"",&local_29);
  std::__cxx11::ostringstream::str(psVar2);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  poVar3 = (ostream *)g_oss_abi_cxx11_();
  return poVar3;
}

Assistant:

std::ostream* getTlsOss() {
        g_oss.clear(); // there shouldn't be anything worth clearing in the flags
        g_oss.str(""); // the slow way of resetting a string stream
        //g_oss.seekp(0); // optimal reset - as seen here: https://stackoverflow.com/a/624291/3162383
        return &g_oss;
    }